

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktTextureMipmapTests.cpp
# Opt level: O0

void __thiscall
vkt::texture::anon_unknown_0::Texture3DLodControlTestInstance::Texture3DLodControlTestInstance
          (Texture3DLodControlTestInstance *this,Context *context,
          Texture3DMipmapTestCaseParameters *testParameters)

{
  int iVar1;
  TestTexture3D *pTVar2;
  RGBA local_11c;
  Vector<float,_4> local_118;
  Vector<float,_4> local_108;
  Vec4 local_f8;
  PixelBufferAccess local_e8;
  uint local_c0;
  uint local_bc;
  deUint32 color;
  deUint32 rgb;
  deUint32 dec;
  deUint32 inc;
  deUint32 step;
  int levelNdx;
  SharedPtr<vkt::pipeline::TestTexture3D> local_a0;
  int local_8c;
  float *pfStack_88;
  int numLevels;
  Vec4 *cBias;
  Vec4 *cScale;
  undefined1 local_70 [8];
  TextureFormatInfo fmtInfo;
  VkFormat format;
  Texture3DMipmapTestCaseParameters *testParameters_local;
  Context *context_local;
  Texture3DLodControlTestInstance *this_local;
  
  TestInstance::TestInstance(&this->super_TestInstance,context);
  (this->super_TestInstance)._vptr_TestInstance =
       (_func_int **)&PTR__Texture3DLodControlTestInstance_01671918;
  this->m_texWidth = 0x20;
  this->m_texHeight = 0x20;
  this->m_texDepth = 0x20;
  Texture3DMipmapTestCaseParameters::Texture3DMipmapTestCaseParameters
            (&this->m_testParameters,testParameters);
  this->m_minFilter =
       (testParameters->super_Texture3DTestCaseParameters).super_Texture2DTestCaseParameters.
       super_TextureCommonTestCaseParameters.minFilter;
  de::SharedPtr<vkt::pipeline::TestTexture3D>::SharedPtr(&this->m_texture,(TestTexture3D *)0x0);
  util::TextureRenderer::TextureRenderer
            (&this->m_renderer,context,
             (testParameters->super_Texture3DTestCaseParameters).super_Texture2DTestCaseParameters.
             super_TextureCommonTestCaseParameters.sampleCount,this->m_texWidth << 2,
             this->m_texHeight << 2);
  fmtInfo.lookupBias.m_data[2] = 5.1848e-44;
  cScale = (Vec4 *)::vk::mapVkFormat(VK_FORMAT_R8G8B8A8_UNORM);
  tcu::getTextureFormatInfo((TextureFormatInfo *)local_70,(TextureFormat *)&cScale);
  cBias = (Vec4 *)(fmtInfo.valueMax.m_data + 2);
  pfStack_88 = fmtInfo.lookupScale.m_data + 2;
  iVar1 = de::max<int>(this->m_texWidth,this->m_texHeight);
  iVar1 = de::max<int>(iVar1,this->m_texDepth);
  local_8c = deLog2Floor32(iVar1);
  local_8c = local_8c + 1;
  pTVar2 = (TestTexture3D *)operator_new(0x78);
  _step = ::vk::mapVkFormat(VK_FORMAT_R8G8B8A8_UNORM);
  vkt::pipeline::TestTexture3D::TestTexture3D
            (pTVar2,(TextureFormat *)&step,this->m_texWidth,this->m_texHeight,this->m_texDepth);
  de::SharedPtr<vkt::pipeline::TestTexture3D>::SharedPtr(&local_a0,pTVar2);
  de::SharedPtr<vkt::pipeline::TestTexture3D>::operator=(&this->m_texture,&local_a0);
  de::SharedPtr<vkt::pipeline::TestTexture3D>::~SharedPtr(&local_a0);
  for (inc = 0; (int)inc < local_8c; inc = inc + 1) {
    dec = (deUint32)(0xff / (long)(local_8c + -1));
    rgb = deClamp32(dec * inc,0,0xff);
    color = 0xff - rgb;
    local_c0 = rgb << 0x10 | color * 0x100;
    local_bc = local_c0 | 0xff;
    local_c0 = local_c0 | 0xff0000ff;
    pTVar2 = de::SharedPtr<vkt::pipeline::TestTexture3D>::operator->(&this->m_texture);
    (*(pTVar2->super_TestTexture)._vptr_TestTexture[7])(&local_e8,pTVar2,(ulong)inc,0);
    tcu::RGBA::RGBA(&local_11c,local_c0);
    tcu::RGBA::toVec((RGBA *)&local_118);
    tcu::operator*((tcu *)&local_108,&local_118,cBias);
    tcu::operator+((tcu *)&local_f8,&local_108,(Vector<float,_4> *)pfStack_88);
    tcu::clear(&local_e8,&local_f8);
  }
  util::TextureRenderer::add3DTexture(&this->m_renderer,&this->m_texture);
  return;
}

Assistant:

Texture3DLodControlTestInstance::Texture3DLodControlTestInstance (Context& context, const Texture3DMipmapTestCaseParameters& testParameters)
	: TestInstance		(context)
	, m_texWidth		(32)
	, m_texHeight		(32)
	, m_texDepth		(32)
	, m_testParameters	(testParameters)
	, m_minFilter		(testParameters.minFilter)
	, m_texture			(DE_NULL)
	, m_renderer		(context, testParameters.sampleCount, m_texWidth*4, m_texHeight*4)
{
	const VkFormat			format		= VK_FORMAT_R8G8B8A8_UNORM;
	tcu::TextureFormatInfo	fmtInfo		= tcu::getTextureFormatInfo(mapVkFormat(format));
	const tcu::Vec4&		cScale		= fmtInfo.lookupScale;
	const tcu::Vec4&		cBias		= fmtInfo.lookupBias;
	const int				numLevels	= deLog2Floor32(de::max(de::max(m_texWidth, m_texHeight), m_texDepth))+1;

	m_texture = TestTexture3DSp(new pipeline::TestTexture3D(vk::mapVkFormat(format), m_texWidth, m_texHeight, m_texDepth));

	// Fill texture with colored grid.
	for (int levelNdx = 0; levelNdx < numLevels; levelNdx++)
	{
		const deUint32	step	= 0xff / (numLevels-1);
		const deUint32	inc		= deClamp32(step*levelNdx, 0x00, 0xff);
		const deUint32	dec		= 0xff - inc;
		const deUint32	rgb		= (inc << 16) | (dec << 8) | 0xff;
		const deUint32	color	= 0xff000000 | rgb;

		tcu::clear(m_texture->getLevel(levelNdx, 0), tcu::RGBA(color).toVec()*cScale + cBias);
	}

	m_renderer.add3DTexture(m_texture);
}